

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

TFilterCoefficients *
calculateCoefficientsFirstOrderHighPass(TFilterCoefficients *__return_storage_ptr__,int fc,int fs)

{
  double dVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  
  __return_storage_ptr__->c0 = 0.0;
  __return_storage_ptr__->d0 = 0.0;
  __return_storage_ptr__->xnz1 = 0.0;
  __return_storage_ptr__->xnz2 = 0.0;
  __return_storage_ptr__->ynz1 = 0.0;
  __return_storage_ptr__->ynz2 = 0.0;
  dVar1 = (double)(((float)fc * 6.2831855) / (float)fs);
  dVar2 = cos(dVar1);
  dVar1 = sin(dVar1);
  fVar4 = (float)(dVar2 / (dVar1 + 1.0));
  fVar3 = (fVar4 + 1.0) * 0.5;
  __return_storage_ptr__->a0 = fVar3;
  __return_storage_ptr__->a1 = -fVar3;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->b1 = -fVar4;
  __return_storage_ptr__->b2 = 0.0;
  return __return_storage_ptr__;
}

Assistant:

TFilterCoefficients calculateCoefficientsFirstOrderHighPass(int fc, int fs) {
    TFilterCoefficients res;

    float th = 2.0 * pi * fc / fs;
    float g = cos(th) / (1.0 + sin(th));
    res.a0 = (1.0 + g) / 2.0;
    res.a1 = -((1.0 + g) / 2.0);
    res.a2 = 0.0;
    res.b1 = -g;
    res.b2 = 0.0;

    return res;
}